

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *
slang::ast::getGenerateBlockName
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
           *__return_storage_ptr__,SyntaxNode *node)

{
  SyntaxNode *pSVar1;
  SourceLocation SVar2;
  SyntaxKind SVar3;
  string_view sVar4;
  Token token;
  Token local_38;
  
  if (node->kind == GenerateBlock) {
    pSVar1 = node[3].parent;
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = node[4].parent;
      if (pSVar1 == (SyntaxNode *)0x0) goto LAB_003acb03;
      SVar3 = *(SyntaxKind *)&pSVar1[1].previewNode;
      local_38.rawLen = *(uint32_t *)((long)&pSVar1[1].previewNode + 4);
      local_38.info._0_4_ = pSVar1[2].kind;
      local_38.info._4_4_ = *(undefined4 *)&pSVar1[2].field_0x4;
    }
    else {
      SVar3 = pSVar1[1].kind;
      local_38.rawLen = *(uint32_t *)&pSVar1[1].field_0x4;
      local_38.info._0_4_ = *(SyntaxKind *)&pSVar1[1].parent;
      local_38.info._4_4_ = *(undefined4 *)((long)&pSVar1[1].parent + 4);
    }
    local_38.kind = (short)SVar3;
    local_38._2_1_ = (char)(SVar3 >> 0x10);
    local_38.numFlags.raw = (char)(SVar3 >> 0x18);
    sVar4 = parsing::Token::valueText(&local_38);
    SVar2 = parsing::Token::location(&local_38);
    (__return_storage_ptr__->first)._M_len = sVar4._M_len;
    (__return_storage_ptr__->first)._M_str = sVar4._M_str;
  }
  else {
LAB_003acb03:
    local_38 = slang::syntax::SyntaxNode::getFirstToken(node);
    SVar2 = parsing::Token::location(&local_38);
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = "";
  }
  __return_storage_ptr__->second = SVar2;
  return __return_storage_ptr__;
}

Assistant:

static std::pair<std::string_view, SourceLocation> getGenerateBlockName(const SyntaxNode& node) {
    if (node.kind == SyntaxKind::GenerateBlock) {
        // Try to find a name for this block. Generate blocks allow the name to be specified twice
        // (for no good reason) so check both locations.
        const GenerateBlockSyntax& block = node.as<GenerateBlockSyntax>();
        if (block.label) {
            auto token = block.label->name;
            return {token.valueText(), token.location()};
        }

        if (block.beginName) {
            auto token = block.beginName->name;
            return {token.valueText(), token.location()};
        }
    }

    return {""sv, node.getFirstToken().location()};
}